

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamRandomAccessController::~BamRandomAccessController
          (BamRandomAccessController *this)

{
  pointer pcVar1;
  
  if (this->m_index != (BamIndex *)0x0) {
    (*this->m_index->_vptr_BamIndex[1])();
    this->m_index = (BamIndex *)0x0;
  }
  (this->m_region).LeftRefID = -1;
  (this->m_region).LeftPosition = -1;
  (this->m_region).RightRefID = -1;
  (this->m_region).RightPosition = -1;
  this->m_hasAlignmentsInRegion = true;
  pcVar1 = (this->m_errorString)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_errorString).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

BamRandomAccessController::~BamRandomAccessController(void) {
    Close();
}